

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_SetActivityFactors_rec(Cec_ManSat_t *p,Gia_Obj_t *pObj,int LevelMin,int LevelMax)

{
  sat_solver *psVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  Gia_Man_t *pGVar8;
  
  pGVar8 = p->pAig;
  pGVar4 = pGVar8->pObjs;
  if (pGVar4 <= pObj) {
    while (pObj < pGVar4 + pGVar8->nObjs) {
      iVar7 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (pGVar8->nTravIdsAlloc <= iVar7) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (pGVar8->pTravIds[iVar7] == pGVar8->nTravIds) {
        return;
      }
      pGVar8->pTravIds[iVar7] = pGVar8->nTravIds;
      iVar7 = Gia_ObjLevel(pGVar8,pObj);
      if (iVar7 <= LevelMin) {
        return;
      }
      uVar6 = *(ulong *)pObj;
      if ((~(uint)uVar6 & 0x9fffffff) == 0) {
        return;
      }
      pGVar8 = p->pAig;
      pGVar4 = pGVar8->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + pGVar8->nObjs <= pObj)) break;
      iVar7 = p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
      if ((long)iVar7 != 0) {
        iVar2 = Gia_ObjLevel(pGVar8,pObj);
        psVar1 = p->pSat;
        psVar1->factors[iVar7] =
             (double)(((float)(iVar2 - LevelMin) * 20.0) / (float)(LevelMax - LevelMin));
        uVar3 = (psVar1->act_vars).size;
        if (uVar3 == (psVar1->act_vars).cap) {
          iVar2 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar2 = uVar3 * 2;
          }
          piVar5 = (psVar1->act_vars).ptr;
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc((long)iVar2 << 2);
          }
          else {
            piVar5 = (int *)realloc(piVar5,(long)iVar2 << 2);
          }
          (psVar1->act_vars).ptr = piVar5;
          if (piVar5 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(psVar1->act_vars).cap * 9.5367431640625e-07,
                   (double)iVar2 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          (psVar1->act_vars).cap = iVar2;
          uVar3 = (psVar1->act_vars).size;
        }
        (psVar1->act_vars).size = uVar3 + 1;
        (psVar1->act_vars).ptr[(int)uVar3] = iVar7;
        uVar6 = *(ulong *)pObj;
      }
      Cec_SetActivityFactors_rec(p,pObj + -(uVar6 & 0x1fffffff),LevelMin,LevelMax);
      pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar8 = p->pAig;
      pGVar4 = pGVar8->pObjs;
      if (pObj < pGVar4) break;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_SetActivityFactors_rec( Cec_ManSat_t * p, Gia_Obj_t * pObj, int LevelMin, int LevelMax )
{
    float dActConeBumpMax = 20.0;
    int iVar;
    // skip visited variables
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    // add the PI to the list
    if ( Gia_ObjLevel(p->pAig, pObj) <= LevelMin || Gia_ObjIsCi(pObj) )
        return;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pPars->dActConeBumpMax / ThisBump
    if ( (iVar = Cec_ObjSatNum(p,pObj)) )
    {
        p->pSat->factors[iVar] = dActConeBumpMax * (Gia_ObjLevel(p->pAig, pObj) - LevelMin)/(LevelMax - LevelMin);
        veci_push(&p->pSat->act_vars, iVar);
    }
    // explore the fanins
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin0(pObj), LevelMin, LevelMax );
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin1(pObj), LevelMin, LevelMax );
}